

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dynamic_integer_points_kd_tree_decoder.h
# Opt level: O0

bool __thiscall
draco::DynamicIntegerPointsKdTreeDecoder<5>::
DecodePoints<draco::PointAttributeVectorOutputIterator<unsigned_int>>
          (DynamicIntegerPointsKdTreeDecoder<5> *this,DecoderBuffer *buffer,
          PointAttributeVectorOutputIterator<unsigned_int> *oit,uint32_t oit_max_points)

{
  bool bVar1;
  uint in_ECX;
  FoldedBit32Decoder<draco::RAnsBitDecoder> *in_RDI;
  PointAttributeVectorOutputIterator<unsigned_int> *in_stack_000001e8;
  uint32_t in_stack_000001f4;
  DynamicIntegerPointsKdTreeDecoder<5> *in_stack_000001f8;
  undefined4 in_stack_ffffffffffffffd8;
  FoldedBit32Decoder<draco::RAnsBitDecoder> *source_buffer;
  undefined7 in_stack_fffffffffffffff8;
  undefined1 in_stack_ffffffffffffffff;
  
  source_buffer = in_RDI;
  bVar1 = DecoderBuffer::Decode<unsigned_int>
                    ((DecoderBuffer *)CONCAT44(in_ECX,in_stack_ffffffffffffffd8),(uint *)in_RDI);
  if (bVar1) {
    if (*(uint *)&in_RDI->folded_number_decoders_ < 0x21) {
      bVar1 = DecoderBuffer::Decode<unsigned_int>
                        ((DecoderBuffer *)CONCAT44(in_ECX,in_stack_ffffffffffffffd8),(uint *)in_RDI)
      ;
      if (bVar1) {
        if (*(int *)&(in_RDI->folded_number_decoders_).field_0x4 == 0) {
          bVar1 = true;
        }
        else if (in_ECX < *(uint *)&(in_RDI->folded_number_decoders_).field_0x4) {
          bVar1 = false;
        }
        else {
          *(undefined4 *)&(in_RDI->folded_number_decoders_).field_0x8 = 0;
          bVar1 = FoldedBit32Decoder<draco::RAnsBitDecoder>::StartDecoding
                            ((FoldedBit32Decoder<draco::RAnsBitDecoder> *)
                             CONCAT44(in_ECX,in_stack_ffffffffffffffd8),(DecoderBuffer *)in_RDI);
          if (bVar1) {
            bVar1 = DirectBitDecoder::StartDecoding
                              ((DirectBitDecoder *)
                               CONCAT17(in_stack_ffffffffffffffff,in_stack_fffffffffffffff8),
                               (DecoderBuffer *)source_buffer);
            if (bVar1) {
              bVar1 = DirectBitDecoder::StartDecoding
                                ((DirectBitDecoder *)
                                 CONCAT17(in_stack_ffffffffffffffff,in_stack_fffffffffffffff8),
                                 (DecoderBuffer *)source_buffer);
              if (bVar1) {
                bVar1 = DirectBitDecoder::StartDecoding
                                  ((DirectBitDecoder *)
                                   CONCAT17(in_stack_ffffffffffffffff,in_stack_fffffffffffffff8),
                                   (DecoderBuffer *)source_buffer);
                if (bVar1) {
                  bVar1 = DecodeInternal<draco::PointAttributeVectorOutputIterator<unsigned_int>>
                                    (in_stack_000001f8,in_stack_000001f4,in_stack_000001e8);
                  if (bVar1) {
                    FoldedBit32Decoder<draco::RAnsBitDecoder>::EndDecoding(in_RDI);
                    DirectBitDecoder::EndDecoding
                              ((DirectBitDecoder *)&in_RDI[1].folded_number_decoders_.field_0x10);
                    DirectBitDecoder::EndDecoding
                              ((DirectBitDecoder *)&in_RDI[1].folded_number_decoders_.field_0x38);
                    DirectBitDecoder::EndDecoding
                              ((DirectBitDecoder *)&in_RDI[1].folded_number_decoders_.field_0x60);
                    bVar1 = true;
                  }
                  else {
                    bVar1 = false;
                  }
                }
                else {
                  bVar1 = false;
                }
              }
              else {
                bVar1 = false;
              }
            }
            else {
              bVar1 = false;
            }
          }
          else {
            bVar1 = false;
          }
        }
      }
      else {
        bVar1 = false;
      }
    }
    else {
      bVar1 = false;
    }
  }
  else {
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

bool DynamicIntegerPointsKdTreeDecoder<compression_level_t>::DecodePoints(
    DecoderBuffer *buffer, OutputIteratorT &oit, uint32_t oit_max_points) {
  if (!buffer->Decode(&bit_length_)) {
    return false;
  }
  if (bit_length_ > 32) {
    return false;
  }
  if (!buffer->Decode(&num_points_)) {
    return false;
  }
  if (num_points_ == 0) {
    return true;
  }
  if (num_points_ > oit_max_points) {
    return false;
  }
  num_decoded_points_ = 0;

  if (!numbers_decoder_.StartDecoding(buffer)) {
    return false;
  }
  if (!remaining_bits_decoder_.StartDecoding(buffer)) {
    return false;
  }
  if (!axis_decoder_.StartDecoding(buffer)) {
    return false;
  }
  if (!half_decoder_.StartDecoding(buffer)) {
    return false;
  }

  if (!DecodeInternal(num_points_, oit)) {
    return false;
  }

  numbers_decoder_.EndDecoding();
  remaining_bits_decoder_.EndDecoding();
  axis_decoder_.EndDecoding();
  half_decoder_.EndDecoding();

  return true;
}